

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O3

string * __thiscall
spirv_cross::ParsedIR::get_member_decoration_string_abi_cxx11_
          (ParsedIR *this,TypeID id,uint32_t index,Decoration decoration)

{
  bool bVar1;
  Meta *pMVar2;
  string *psVar3;
  
  pMVar2 = find_meta(this,(ID)id.id);
  if ((pMVar2 == (Meta *)0x0) || (bVar1 = has_member_decoration(this,id,index,decoration), !bVar1))
  {
    psVar3 = &this->empty_string;
  }
  else {
    psVar3 = &this->empty_string;
    if (decoration == DecorationHlslSemanticGOOGLE) {
      psVar3 = &(pMVar2->members).super_VectorView<spirv_cross::Meta::Decoration>.ptr[index].
                hlsl_semantic;
    }
  }
  return psVar3;
}

Assistant:

const string &ParsedIR::get_member_decoration_string(TypeID id, uint32_t index, Decoration decoration) const
{
	auto *m = find_meta(id);
	if (m)
	{
		if (!has_member_decoration(id, index, decoration))
			return empty_string;

		auto &dec = m->members[index];

		switch (decoration)
		{
		case DecorationHlslSemanticGOOGLE:
			return dec.hlsl_semantic;

		default:
			return empty_string;
		}
	}
	else
		return empty_string;
}